

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

bool __thiscall graphics101::Mesh::writeToOBJ(Mesh *this,string *path)

{
  vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_> *this_00;
  pointer pTVar1;
  pointer pTVar2;
  pointer pvVar3;
  pointer pvVar4;
  ostream *poVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  pointer pTVar9;
  vec<2,_float,_(glm::qualifier)0> *vt;
  pointer pvVar10;
  char *pcVar11;
  pointer pTVar12;
  pointer pTVar13;
  pointer pTVar14;
  int vi;
  long lVar15;
  Triangle *face;
  vec<3,_float,_(glm::qualifier)0> *v;
  pointer pvVar16;
  ulong uVar17;
  int face_index_1;
  bool bVar18;
  vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_> *__range2;
  ofstream out;
  undefined8 auStack_228 [3];
  byte abStack_210 [480];
  
  pTVar9 = (this->face_normals).
           super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>._M_impl
           .super__Vector_impl_data._M_start;
  pTVar12 = (this->face_normals).
            super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if ((pTVar12 == pTVar9) ||
     ((long)pTVar12 - (long)pTVar9 ==
      (long)(this->face_positions).
            super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(this->face_positions).
            super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
            _M_impl.super__Vector_impl_data._M_start)) {
    pTVar1 = (this->face_texcoords).
             super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pTVar2 = (this->face_texcoords).
             super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pTVar1 == pTVar2) {
      pTVar13 = (this->face_positions).
                super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pTVar14 = (this->face_positions).
                super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      pTVar13 = (this->face_positions).
                super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pTVar14 = (this->face_positions).
                super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if ((long)pTVar1 - (long)pTVar2 != (long)pTVar14 - (long)pTVar13) {
        pcVar11 = 
        "ERROR: Faces for texture coordinates don\'t match faces for positions. Can\'t write mesh to OBJ.\n"
        ;
        goto LAB_001045b2;
      }
    }
    this_00 = &this->face_positions;
    bVar18 = true;
    for (; pTVar13 != pTVar14; pTVar13 = pTVar13 + 1) {
      for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
        bVar18 = (bool)(-1 < (&pTVar13->A)[lVar15] & bVar18 &
                       (ulong)(uint)(&pTVar13->A)[lVar15] <
                       (ulong)(((long)(this->positions).
                                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->positions).
                                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) / 0xc));
      }
    }
    if (!bVar18) {
      std::operator<<((ostream *)&std::cerr,
                      "WARNING: Faces for positions contain invalid indices. OBJ will contain an invalid mesh.\n"
                     );
      pTVar9 = (this->face_normals).
               super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pTVar12 = (this->face_normals).
                super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
    bVar18 = true;
    for (; pTVar9 != pTVar12; pTVar9 = pTVar9 + 1) {
      for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
        bVar18 = (bool)(-1 < (&pTVar9->A)[lVar15] & bVar18 &
                       (ulong)(uint)(&pTVar9->A)[lVar15] <
                       (ulong)(((long)(this->normals).
                                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->normals).
                                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) / 0xc));
      }
    }
    if (!bVar18) {
      std::operator<<((ostream *)&std::cerr,
                      "WARNING: Faces for normals contain invalid indices. OBJ will contain an invalid mesh.\n"
                     );
    }
    bVar18 = true;
    for (pTVar9 = (this->face_texcoords).
                  super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pTVar9 != (this->face_texcoords).
                  super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
                  _M_impl.super__Vector_impl_data._M_finish; pTVar9 = pTVar9 + 1) {
      for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
        bVar18 = (bool)(-1 < (&pTVar9->A)[lVar15] & bVar18 &
                       (ulong)(uint)(&pTVar9->A)[lVar15] <
                       (ulong)((long)(this->texcoords).
                                     super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->texcoords).
                                     super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
    }
    if (!bVar18) {
      std::operator<<((ostream *)&std::cerr,
                      "WARNING: Faces for texture coordinates contain invalid indices. OBJ will contain an invalid mesh.\n"
                     );
    }
    std::ofstream::ofstream(&out,(string *)path,_S_out);
    bVar18 = (abStack_210[*(long *)(_out + -0x18)] & 5) == 0;
    if (bVar18) {
      std::operator<<((ostream *)&out,"# OBJ written by Mesh::writeToOBJ()\n");
      *(undefined8 *)((long)auStack_228 + *(long *)(_out + -0x18)) = 0x20;
      std::operator<<((ostream *)&out,'\n');
      pvVar3 = (this->positions).
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pvVar16 = (this->positions).
                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pvVar16 != pvVar3;
          pvVar16 = pvVar16 + 1) {
        poVar5 = std::operator<<((ostream *)&out,"v ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(pvVar16->field_0).x);
        poVar5 = std::operator<<(poVar5,' ');
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(pvVar16->field_1).y);
        poVar5 = std::operator<<(poVar5,' ');
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(pvVar16->field_2).z);
        std::operator<<(poVar5,'\n');
      }
      std::operator<<((ostream *)&out,'\n');
      pvVar4 = (this->texcoords).
               super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pvVar10 = (this->texcoords).
                     super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pvVar10 != pvVar4;
          pvVar10 = pvVar10 + 1) {
        poVar5 = std::operator<<((ostream *)&out,"vt ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(pvVar10->field_0).x);
        poVar5 = std::operator<<(poVar5,' ');
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(pvVar10->field_1).y);
        std::operator<<(poVar5,'\n');
      }
      std::operator<<((ostream *)&out,'\n');
      pvVar3 = (this->normals).
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pvVar16 = (this->normals).
                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pvVar16 != pvVar3;
          pvVar16 = pvVar16 + 1) {
        poVar5 = std::operator<<((ostream *)&out,"vn ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(pvVar16->field_0).x);
        poVar5 = std::operator<<(poVar5,' ');
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(pvVar16->field_1).y);
        poVar5 = std::operator<<(poVar5,' ');
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(pvVar16->field_2).z);
        std::operator<<(poVar5,'\n');
      }
      std::operator<<((ostream *)&out,'\n');
      pTVar9 = (this->face_normals).
               super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pTVar12 = (this->face_normals).
                super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if ((this->face_texcoords).
          super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (this->face_texcoords).
          super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        if (pTVar9 == pTVar12) {
          pTVar12 = (this->face_positions).
                    super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (pTVar9 = (this->face_positions).
                        super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                        ._M_impl.super__Vector_impl_data._M_start; pTVar9 != pTVar12;
              pTVar9 = pTVar9 + 1) {
            poVar5 = std::operator<<((ostream *)&out,"f ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,pTVar9->A + 1);
            poVar5 = std::operator<<(poVar5,' ');
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,pTVar9->B + 1);
            poVar5 = std::operator<<(poVar5,' ');
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,pTVar9->C + 1);
            std::operator<<(poVar5,'\n');
          }
        }
        else {
          for (uVar17 = 0;
              uVar17 < (ulong)(((long)(this->face_positions).
                                      super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->face_positions).
                                     super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                                     ._M_impl.super__Vector_impl_data._M_start) / 0xc);
              uVar17 = uVar17 + 1) {
            pvVar6 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::at
                               (this_00,uVar17);
            pvVar7 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::at
                               (&this->face_normals,uVar17);
            poVar5 = std::operator<<((ostream *)&out,"f ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar6->A + 1);
            poVar5 = std::operator<<(poVar5,"//");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar7->A + 1);
            poVar5 = std::operator<<(poVar5,' ');
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar6->B + 1);
            poVar5 = std::operator<<(poVar5,"//");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar7->B + 1);
            poVar5 = std::operator<<(poVar5,' ');
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar6->C + 1);
            poVar5 = std::operator<<(poVar5,"//");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar7->C + 1);
            std::operator<<(poVar5,'\n');
          }
        }
      }
      else if (pTVar9 == pTVar12) {
        for (uVar17 = 0;
            uVar17 < (ulong)(((long)(this->face_positions).
                                    super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->face_positions).
                                   super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0xc);
            uVar17 = uVar17 + 1) {
          pvVar6 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::at
                             (this_00,uVar17);
          pvVar7 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::at
                             (&this->face_texcoords,uVar17);
          poVar5 = std::operator<<((ostream *)&out,"f ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar6->A + 1);
          poVar5 = std::operator<<(poVar5,'/');
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar7->A + 1);
          poVar5 = std::operator<<(poVar5,' ');
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar6->B + 1);
          poVar5 = std::operator<<(poVar5,'/');
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar7->B + 1);
          poVar5 = std::operator<<(poVar5,' ');
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar6->C + 1);
          poVar5 = std::operator<<(poVar5,'/');
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar7->C + 1);
          std::operator<<(poVar5,'\n');
        }
      }
      else {
        for (uVar17 = 0;
            uVar17 < (ulong)(((long)(this->face_positions).
                                    super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->face_positions).
                                   super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0xc);
            uVar17 = uVar17 + 1) {
          pvVar6 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::at
                             (this_00,uVar17);
          pvVar7 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::at
                             (&this->face_texcoords,uVar17);
          pvVar8 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::at
                             (&this->face_normals,uVar17);
          poVar5 = std::operator<<((ostream *)&out,"f ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar6->A + 1);
          poVar5 = std::operator<<(poVar5,'/');
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar7->A + 1);
          poVar5 = std::operator<<(poVar5,'/');
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar8->A + 1);
          poVar5 = std::operator<<(poVar5,' ');
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar6->B + 1);
          poVar5 = std::operator<<(poVar5,'/');
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar7->B + 1);
          poVar5 = std::operator<<(poVar5,'/');
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar8->B + 1);
          poVar5 = std::operator<<(poVar5,' ');
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar6->C + 1);
          poVar5 = std::operator<<(poVar5,'/');
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar7->C + 1);
          poVar5 = std::operator<<(poVar5,'/');
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar8->C + 1);
          std::operator<<(poVar5,'\n');
        }
      }
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cerr,"ERROR: Could not open file for writing: ");
      poVar5 = std::operator<<(poVar5,(string *)path);
      std::operator<<(poVar5,'\n');
    }
    std::ofstream::~ofstream(&out);
  }
  else {
    pcVar11 = 
    "ERROR: Faces for normals don\'t match faces for positions. Can\'t write mesh to OBJ.\n";
LAB_001045b2:
    std::operator<<((ostream *)&std::cerr,pcVar11);
    bVar18 = false;
  }
  return bVar18;
}

Assistant:

bool Mesh::writeToOBJ( const std::string& path ) {
    using namespace std;
    
    if( face_normals.size() > 0 && face_normals.size() != face_positions.size() ) {
        cerr << "ERROR: Faces for normals don't match faces for positions. Can't write mesh to OBJ.\n";
        return false;
    }
    if( face_texcoords.size() > 0 && face_texcoords.size() != face_positions.size() ) {
        cerr << "ERROR: Faces for texture coordinates don't match faces for positions. Can't write mesh to OBJ.\n";
        return false;
    }
    
    // Check for valid position indices in face_positions.
    {
        bool valid_indices = true;
        for( const auto& f : face_positions ) {
            for( int vi = 0; vi < 3; ++vi ) {
                if( f[vi] < 0 || f[vi] >= positions.size() ) {
                    valid_indices = false;
                }
            }
        }
        if( !valid_indices ) {
            cerr << "WARNING: Faces for positions contain invalid indices. OBJ will contain an invalid mesh.\n";
            // return false;
        }
    }
    // Check for valid normal indices in face_normals.
    {
        bool valid_indices = true;
        for( const auto& f : face_normals ) {
            for( int vi = 0; vi < 3; ++vi ) {
                if( f[vi] < 0 || f[vi] >= normals.size() ) {
                    valid_indices = false;
                }
            }
        }
        if( !valid_indices ) {
            cerr << "WARNING: Faces for normals contain invalid indices. OBJ will contain an invalid mesh.\n";
            // return false;
        }
    }
    // Check for valid texture coordinate indices in face_texcoords.
    {
        bool valid_indices = true;
        for( const auto& f : face_texcoords ) {
            for( int vi = 0; vi < 3; ++vi ) {
                if( f[vi] < 0 || f[vi] >= texcoords.size() ) {
                    valid_indices = false;
                }
            }
        }
        if( !valid_indices ) {
            cerr << "WARNING: Faces for texture coordinates contain invalid indices. OBJ will contain an invalid mesh.\n";
            // return false;
        }
    }
    
    // Open the file.
    ofstream out( path );
    if( !out ) {
        cerr << "ERROR: Could not open file for writing: " << path << '\n';
        return false;
    }
    
    out << "# OBJ written by Mesh::writeToOBJ()\n";
    out.precision( 32 );
    
    out << '\n';
    for( const auto& v : positions ) {
        out << "v " << v[0] << ' ' << v[1] << ' ' << v[2] << '\n';
    }
    
    out << '\n';
    for( const auto& vt : texcoords ) {
        out << "vt " << vt[0] << ' ' << vt[1] << '\n';
    }
    
    out << '\n';
    for( const auto& vn : normals ) {
        out << "vn " << vn[0] << ' ' << vn[1] << ' ' << vn[2] << '\n';
    }
    
    // OBJ's are 1-indexed, so add one to all indices.
    
    out << '\n';
    if( face_texcoords.empty() && face_normals.empty() ) {
        for( const auto& face : face_positions ) {
            out << "f " << face[0]+1 << ' ' << face[1]+1 << ' ' << face[2]+1 << '\n';
        }
    }
    else if( face_normals.empty() ) {
        for( int face_index = 0; face_index < face_positions.size(); ++face_index ) {
            const auto& p = face_positions.at(face_index);
            const auto& t = face_texcoords.at(face_index);
            out << "f "
                << p[0]+1 << '/' << t[0]+1 << ' '
                << p[1]+1 << '/' << t[1]+1 << ' '
                << p[2]+1 << '/' << t[2]+1 << '\n';
        }
    }
    else if( face_texcoords.empty() ) {
        for( int face_index = 0; face_index < face_positions.size(); ++face_index ) {
            const auto& p = face_positions.at(face_index);
            const auto& n = face_normals.at(face_index);
            out << "f "
                << p[0]+1 << "//" << n[0]+1 << ' '
                << p[1]+1 << "//" << n[1]+1 << ' '
                << p[2]+1 << "//" << n[2]+1 << '\n';
        }
    }
    else {
        for( int face_index = 0; face_index < face_positions.size(); ++face_index ) {
            const auto& p = face_positions.at(face_index);
            const auto& t = face_texcoords.at(face_index);
            const auto& n = face_normals.at(face_index);
            out << "f "
                << p[0]+1 << '/' << t[0]+1 << '/' << n[0]+1 << ' '
                << p[1]+1 << '/' << t[1]+1 << '/' << n[1]+1 << ' '
                << p[2]+1 << '/' << t[2]+1 << '/' << n[2]+1 << '\n';
        }
    }

    return true;
}